

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

RPCHelpMan * estimatesmartfee(void)

{
  size_type *psVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string default_info;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_05;
  string description_06;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar4 [32];
  pointer *ppRVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  RPCHelpMan *in_RDI;
  undefined8 uVar9;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff508;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff50c;
  undefined8 in_stack_fffffffffffff518;
  undefined8 in_stack_fffffffffffff520;
  undefined8 in_stack_fffffffffffff528;
  code *pcVar12;
  undefined8 in_stack_fffffffffffff530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff538;
  pointer in_stack_fffffffffffff548;
  pointer pRVar13;
  pointer in_stack_fffffffffffff550;
  pointer pRVar14;
  pointer in_stack_fffffffffffff558;
  pointer pRVar15;
  undefined8 in_stack_fffffffffffff560;
  pointer in_stack_fffffffffffff568;
  pointer pRVar16;
  pointer in_stack_fffffffffffff570;
  pointer pRVar17;
  pointer in_stack_fffffffffffff578;
  pointer pRVar18;
  pointer in_stack_fffffffffffff580;
  pointer in_stack_fffffffffffff588;
  pointer in_stack_fffffffffffff590;
  pointer in_stack_fffffffffffff598;
  pointer in_stack_fffffffffffff5a0;
  pointer in_stack_fffffffffffff5a8;
  undefined1 auVar19 [32];
  undefined1 in_stack_fffffffffffff5b0 [64];
  vector<RPCArg,_std::allocator<RPCArg>_> local_a10;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  ulong *local_938;
  undefined8 local_930;
  ulong local_928;
  undefined8 uStack_920;
  ulong *local_918;
  size_type local_910;
  ulong local_908;
  undefined8 uStack_900;
  long *local_8f8 [2];
  long local_8e8 [2];
  long *local_8d8 [2];
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  long *local_898 [2];
  long local_888 [2];
  RPCResult local_878;
  long *local_7f0 [2];
  long local_7e0 [2];
  long *local_7d0 [2];
  long local_7c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  size_type *local_790;
  size_type local_788;
  size_type local_780 [2];
  long *local_770 [2];
  long local_760 [2];
  RPCResult local_750;
  RPCResult local_6c8;
  RPCResult local_640;
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  RPCResult local_578;
  undefined1 local_4f0;
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8;
  undefined7 uStack_4d7;
  undefined1 local_4c8 [32];
  long *local_4a8 [2];
  long local_498 [2];
  string local_488;
  size_type *local_468;
  size_type local_460;
  size_type local_458;
  undefined8 uStack_450;
  UniValue local_448;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"estimatesmartfee","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nEstimates the approximate fee per kilobyte needed for a transaction to begin\nconfirmation within conf_target blocks if possible and return the number of blocks\nfor which the estimate is valid. Uses virtual transaction size as defined\nin BIP 141 (witness data is discounted).\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"conf_target","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"Confirmation target in blocks (1 - 1008)","");
  ppRVar5 = (pointer *)
            ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff50c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff508;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff518;
  name.field_2._8_8_ = in_stack_fffffffffffff520;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff530;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff528;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff538;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff548;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff550;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff558;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff560;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff568;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff570;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff578;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff580;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff590;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff588;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff598;
  description_05.field_2._8_8_ = in_stack_fffffffffffff5a0;
  auVar19 = in_stack_fffffffffffff5b0._0_32_;
  opts.oneline_description._M_dataplus._M_p = (pointer)auVar19._0_8_;
  opts.oneline_description._M_string_length = auVar19._8_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar19._16_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff5b0._32_24_;
  opts.hidden = (bool)in_stack_fffffffffffff5b0[0x38];
  opts.also_positional = (bool)in_stack_fffffffffffff5b0[0x39];
  opts._66_6_ = in_stack_fffffffffffff5b0._58_6_;
  opts._0_8_ = in_stack_fffffffffffff5a8;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppRVar5;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_05,opts);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"estimate_mode","");
  UniValue::UniValue<const_char_(&)[11],_char[11],_true>(&local_448,(char (*) [11])0x83fb4a);
  paVar8 = &local_448.val.field_2;
  local_3f0._8_8_ = (long)&local_3f0 + 0x18;
  local_3f0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_448.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p == paVar8) {
    local_3f0._32_8_ = local_448.val.field_2._8_8_;
  }
  else {
    local_3f0._8_8_ = local_448.val._M_dataplus._M_p;
  }
  local_3f0._16_8_ = local_448.val._M_string_length;
  local_448.val._M_string_length = 0;
  local_448.val.field_2._M_local_buf[0] = '\0';
  local_3f0._40_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f0._48_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f0._56_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._64_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_3f0._68_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_3f0._72_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_3f0._76_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_3f0._80_8_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = 2;
  local_4a8[0] = local_498;
  local_448.val._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a8,"default mode will be used","");
  default_info._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff50c;
  default_info._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff508;
  default_info._M_string_length = (size_type)in_RDI;
  default_info.field_2._M_allocated_capacity = in_stack_fffffffffffff518;
  default_info.field_2._8_8_ = in_stack_fffffffffffff520;
  common::FeeModesDetail(&local_488,default_info);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_488,0,0,"The fee estimate mode.\n",0x17);
  local_468 = &local_458;
  psVar1 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar8) {
    local_458 = paVar8->_M_allocated_capacity;
    uStack_450 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_458 = paVar8->_M_allocated_capacity;
    local_468 = psVar1;
  }
  local_460 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  local_4e8 = &local_4d8;
  local_4f0 = 0;
  local_4e0 = 0;
  local_4d8 = 0;
  local_4c8._0_8_ = (pointer)0x0;
  local_4c8._8_2_ = 0;
  local_4c8._10_6_ = 0;
  local_4c8._16_2_ = 0;
  local_4c8._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff50c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff508;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff518;
  name_00.field_2._8_8_ = in_stack_fffffffffffff520;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff530;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff528;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff538;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff548;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff550;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff558;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff560;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff568;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff570;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff578;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff580;
  description_06._M_string_length = (size_type)in_stack_fffffffffffff590;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff588;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff598;
  description_06.field_2._8_8_ = in_stack_fffffffffffff5a0;
  auVar19 = in_stack_fffffffffffff5b0._0_32_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)auVar19._0_8_;
  opts_00.oneline_description._M_string_length = auVar19._8_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar19._16_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff5b0._32_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff5b0[0x38];
  opts_00.also_positional = (bool)in_stack_fffffffffffff5b0[0x39];
  opts_00._66_6_ = in_stack_fffffffffffff5b0._58_6_;
  opts_00._0_8_ = in_stack_fffffffffffff5a8;
  RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_06,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (&local_a10,__l,(allocator_type *)&stack0xfffffffffffff5ef);
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"");
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"");
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"feerate","");
  std::operator+(&local_7b0,"estimate fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_7b0,"/kvB (only present if no errors were encountered)");
  local_790 = local_780;
  psVar1 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar8) {
    local_780[0] = paVar8->_M_allocated_capacity;
    local_780[1] = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_780[0] = paVar8->_M_allocated_capacity;
    local_790 = psVar1;
  }
  local_788 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  uVar11 = 0;
  auVar19._4_8_ = in_RDI;
  auVar19._0_4_ = in_stack_fffffffffffff50c;
  auVar19._12_8_ = in_stack_fffffffffffff518;
  auVar19._20_8_ = in_stack_fffffffffffff520;
  auVar19._28_4_ = 0;
  description._M_string_length = in_stack_fffffffffffff530;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528;
  description.field_2 = in_stack_fffffffffffff538;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff550;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff548;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff558;
  RPCResult::RPCResult
            (&local_750,NUM,(string)(auVar19 << 0x20),SUB81(local_770,0),description,inner,true);
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"errors","");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7f0,"Errors encountered during processing (if there are any)","");
  local_898[0] = local_888;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"");
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"error","");
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff50c;
  m_key_name._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff518;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff520;
  description_00._M_string_length = in_stack_fffffffffffff530;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528;
  description_00.field_2 = in_stack_fffffffffffff538;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff550;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff548;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff558;
  RPCResult::RPCResult(&local_878,STR,m_key_name,description_00,inner_00,SUB81(local_898,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_878;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff580,__l_00,
             (allocator_type *)&stack0xfffffffffffff567);
  uVar11 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff50c;
  auVar4._12_8_ = in_stack_fffffffffffff518;
  auVar4._20_8_ = in_stack_fffffffffffff520;
  auVar4._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff530;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528;
  description_01.field_2 = in_stack_fffffffffffff538;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff550;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff548;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff558;
  RPCResult::RPCResult
            (&local_6c8,ARR,(string)(auVar4 << 0x20),SUB81(local_7d0,0),description_01,inner_01,true
            );
  local_8d8[0] = local_8c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"blocks","");
  local_8f8[0] = local_8e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f8,
             "block number where estimate was found\nThe request target will be clamped between 2 and the highest target\nfee estimation is able to return based on how long it has been running.\nAn error is returned if not enough transactions and blocks\nhave been observed to make an estimate for any number of blocks."
             ,"");
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff50c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff518;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff520;
  description_02._M_string_length = in_stack_fffffffffffff530;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff538._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_640,NUM,m_key_name_00,description_02,inner_02,SUB81(local_8d8,0));
  __l_01._M_len = 3;
  __l_01._M_array = &local_750;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff5b8,__l_01,
             (allocator_type *)&stack0xfffffffffffff547);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff50c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff518;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff520;
  description_03._M_string_length = in_stack_fffffffffffff530;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528;
  description_03.field_2 = in_stack_fffffffffffff538;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar14;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar13;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar15;
  RPCResult::RPCResult(&local_578,OBJ,m_key_name_01,description_03,inner_03,SUB81(local_598,0));
  result._4_4_ = in_stack_fffffffffffff50c;
  result.m_type = uVar11;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff518;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff520;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff528;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff530;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff538;
  result._64_8_ = pRVar13;
  result.m_description._M_dataplus._M_p = (pointer)pRVar14;
  result.m_description._M_string_length = (size_type)pRVar15;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff560;
  result.m_description.field_2._8_8_ = pRVar16;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar17;
  result.m_cond._M_string_length = (size_type)pRVar18;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff580;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff588;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff5d0,result);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"estimatesmartfee","");
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"6","");
  HelpExampleCli(&local_958,&local_978,&local_998);
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"estimatesmartfee","");
  local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"6","");
  HelpExampleRpc(&local_9b8,&local_9d8,&local_9f8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    uVar9 = local_958.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_9b8._M_string_length + local_958._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
      uVar9 = local_9b8.field_2._M_allocated_capacity;
    }
    if (local_9b8._M_string_length + local_958._M_string_length <= (ulong)uVar9) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_9b8,0,0,local_958._M_dataplus._M_p,local_958._M_string_length);
      goto LAB_002e9b8a;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_958,local_9b8._M_dataplus._M_p,local_9b8._M_string_length);
LAB_002e9b8a:
  local_938 = &local_928;
  puVar2 = (ulong *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar8) {
    local_928 = paVar8->_M_allocated_capacity;
    uStack_920 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_928 = paVar8->_M_allocated_capacity;
    local_938 = puVar2;
  }
  local_910 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  if (local_938 == &local_928) {
    uStack_900 = uStack_920;
    local_918 = &local_908;
  }
  else {
    local_918 = local_938;
  }
  local_908 = local_928;
  local_930 = 0;
  local_928 = local_928 & 0xffffffffffffff00;
  pcVar12 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:60:9)>
            ::_M_manager;
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:60:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:60:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff538;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar13;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar15;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff560;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar17;
  examples.m_examples._M_string_length = (size_type)in_stack_fffffffffffff580;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar18;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff588;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff590;
  local_938 = &local_928;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff518)),description_04,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar12 != (code *)0x0) {
    (*pcVar12)(&stack0xfffffffffffff518,&stack0xfffffffffffff518,3);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918,local_908 + 1);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938,local_928 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.m_cond._M_dataplus._M_p != &local_578.m_cond.field_2) {
    operator_delete(local_578.m_cond._M_dataplus._M_p,
                    local_578.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.m_description._M_dataplus._M_p != &local_578.m_description.field_2) {
    operator_delete(local_578.m_description._M_dataplus._M_p,
                    local_578.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_578.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.m_key_name._M_dataplus._M_p != &local_578.m_key_name.field_2) {
    operator_delete(local_578.m_key_name._M_dataplus._M_p,
                    local_578.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff5b8);
  lVar10 = 0x198;
  do {
    if ((long *)((long)local_760 + lVar10) != *(long **)((long)local_770 + lVar10)) {
      operator_delete(*(long **)((long)local_770 + lVar10),*(long *)((long)local_760 + lVar10) + 1);
    }
    if ((long *)((long)local_780 + lVar10) != *(long **)((long)&local_790 + lVar10)) {
      operator_delete(*(long **)((long)&local_790 + lVar10),*(long *)((long)local_780 + lVar10) + 1)
      ;
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_7b0._M_dataplus._M_p + lVar10));
    if ((long *)((long)local_7c0 + lVar10) != *(long **)((long)local_7d0 + lVar10)) {
      operator_delete(*(long **)((long)local_7d0 + lVar10),*(long *)((long)local_7c0 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff548);
  if (local_8f8[0] != local_8e8) {
    operator_delete(local_8f8[0],local_8e8[0] + 1);
  }
  if (local_8d8[0] != local_8c8) {
    operator_delete(local_8d8[0],local_8c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff580);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878.m_cond._M_dataplus._M_p != &local_878.m_cond.field_2) {
    operator_delete(local_878.m_cond._M_dataplus._M_p,
                    local_878.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878.m_description._M_dataplus._M_p != &local_878.m_description.field_2) {
    operator_delete(local_878.m_description._M_dataplus._M_p,
                    local_878.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_878.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878.m_key_name._M_dataplus._M_p != &local_878.m_key_name.field_2) {
    operator_delete(local_878.m_key_name._M_dataplus._M_p,
                    local_878.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff568);
  if (local_8b8[0] != local_8a8) {
    operator_delete(local_8b8[0],local_8a8[0] + 1);
  }
  if (local_898[0] != local_888) {
    operator_delete(local_898[0],local_888[0] + 1);
  }
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0],local_7e0[0] + 1);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0],local_7c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff598);
  if (local_790 != local_780) {
    operator_delete(local_790,local_780[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if (local_770[0] != local_760) {
    operator_delete(local_770[0],local_760[0] + 1);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a10);
  lVar10 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar10));
    plVar3 = *(long **)((long)&local_308 + lVar10 + 0x40);
    plVar7 = (long *)((long)&local_308 + lVar10 + 0x50);
    if (plVar7 != plVar3) {
      operator_delete(plVar3,*plVar7 + 1);
    }
    plVar7 = (long *)((long)&local_308 + lVar10 + 0x28);
    plVar3 = *(long **)((long)&local_308 + lVar10 + 0x18);
    if (plVar7 != plVar3) {
      operator_delete(plVar3,*plVar7 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar10));
    if ((long *)((long)local_380 + lVar10) != *(long **)((long)local_390 + lVar10)) {
      operator_delete(*(long **)((long)local_390 + lVar10),*(long *)((long)local_380 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x108;
  } while (lVar10 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c8);
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8,CONCAT71(uStack_4d7,local_4d8) + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_448.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p != &local_448.val.field_2) {
    operator_delete(local_448.val._M_dataplus._M_p,
                    CONCAT71(local_448.val.field_2._M_allocated_capacity._1_7_,
                             local_448.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppRVar5) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan estimatesmartfee()
{
    return RPCHelpMan{"estimatesmartfee",
        "\nEstimates the approximate fee per kilobyte needed for a transaction to begin\n"
        "confirmation within conf_target blocks if possible and return the number of blocks\n"
        "for which the estimate is valid. Uses virtual transaction size as defined\n"
        "in BIP 141 (witness data is discounted).\n",
        {
            {"conf_target", RPCArg::Type::NUM, RPCArg::Optional::NO, "Confirmation target in blocks (1 - 1008)"},
            {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"economical"}, "The fee estimate mode.\n"
              + FeeModesDetail(std::string("default mode will be used"))},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::NUM, "feerate", /*optional=*/true, "estimate fee rate in " + CURRENCY_UNIT + "/kvB (only present if no errors were encountered)"},
                {RPCResult::Type::ARR, "errors", /*optional=*/true, "Errors encountered during processing (if there are any)",
                    {
                        {RPCResult::Type::STR, "", "error"},
                    }},
                {RPCResult::Type::NUM, "blocks", "block number where estimate was found\n"
                "The request target will be clamped between 2 and the highest target\n"
                "fee estimation is able to return based on how long it has been running.\n"
                "An error is returned if not enough transactions and blocks\n"
                "have been observed to make an estimate for any number of blocks."},
        }},
        RPCExamples{
            HelpExampleCli("estimatesmartfee", "6") +
            HelpExampleRpc("estimatesmartfee", "6")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            CBlockPolicyEstimator& fee_estimator = EnsureAnyFeeEstimator(request.context);
            const NodeContext& node = EnsureAnyNodeContext(request.context);
            const CTxMemPool& mempool = EnsureMemPool(node);

            CHECK_NONFATAL(mempool.m_opts.signals)->SyncWithValidationInterfaceQueue();
            unsigned int max_target = fee_estimator.HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
            unsigned int conf_target = ParseConfirmTarget(request.params[0], max_target);
            bool conservative = false;
            if (!request.params[1].isNull()) {
                FeeEstimateMode fee_mode;
                if (!FeeModeFromString(request.params[1].get_str(), fee_mode)) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, InvalidEstimateModeErrorMessage());
                }
                if (fee_mode == FeeEstimateMode::CONSERVATIVE) conservative = true;
            }

            UniValue result(UniValue::VOBJ);
            UniValue errors(UniValue::VARR);
            FeeCalculation feeCalc;
            CFeeRate feeRate{fee_estimator.estimateSmartFee(conf_target, &feeCalc, conservative)};
            if (feeRate != CFeeRate(0)) {
                CFeeRate min_mempool_feerate{mempool.GetMinFee()};
                CFeeRate min_relay_feerate{mempool.m_opts.min_relay_feerate};
                feeRate = std::max({feeRate, min_mempool_feerate, min_relay_feerate});
                result.pushKV("feerate", ValueFromAmount(feeRate.GetFeePerK()));
            } else {
                errors.push_back("Insufficient data or no feerate found");
                result.pushKV("errors", std::move(errors));
            }
            result.pushKV("blocks", feeCalc.returnedTarget);
            return result;
        },
    };
}